

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlReadFd(int fd,char *url,char *encoding,int options)

{
  htmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr input_00;
  undefined8 local_48;
  htmlDocPtr doc;
  xmlParserInputPtr input;
  htmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *url_local;
  htmlDocPtr pxStack_10;
  int fd_local;
  
  local_48 = (htmlDocPtr)0x0;
  ctxt_00 = htmlNewParserCtxt();
  if (ctxt_00 == (htmlParserCtxtPtr)0x0) {
    pxStack_10 = (htmlDocPtr)0x0;
  }
  else {
    htmlCtxtUseOptions(ctxt_00,options);
    input_00 = xmlCtxtNewInputFromFd(ctxt_00,url,fd,encoding,0);
    if (input_00 != (xmlParserInputPtr)0x0) {
      local_48 = htmlCtxtParseDocument(ctxt_00,input_00);
    }
    htmlFreeParserCtxt(ctxt_00);
    pxStack_10 = local_48;
  }
  return pxStack_10;
}

Assistant:

htmlDocPtr
htmlReadFd(int fd, const char *url, const char *encoding, int options)
{
    htmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    htmlDocPtr doc = NULL;

    ctxt = htmlNewParserCtxt();
    if (ctxt == NULL)
        return(NULL);

    htmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromFd(ctxt, url, fd, encoding, 0);

    if (input != NULL)
        doc = htmlCtxtParseDocument(ctxt, input);

    htmlFreeParserCtxt(ctxt);
    return(doc);
}